

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch.c
# Opt level: O3

void * bsearch(void *__key,void *__base,size_t __nmemb,size_t __size,__compar_fn_t __compar)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  
  if (__nmemb != 0) {
    do {
      uVar2 = __nmemb >> 1;
      pvVar3 = (void *)(uVar2 * __size + (long)__base);
      iVar1 = (*__compar)(__key,pvVar3);
      if (iVar1 < 1) {
        if (iVar1 == 0) {
          return pvVar3;
        }
      }
      else {
        __base = (void *)((long)pvVar3 + __size);
        uVar2 = uVar2 - (~(uint)__nmemb & 1);
      }
      __nmemb = uVar2;
    } while (uVar2 != 0);
  }
  return (void *)0x0;
}

Assistant:

void * bsearch( const void * key, const void * base, size_t nmemb, size_t size, int ( *compar )( const void *, const void * ) )
{
    const void * pivot;
    int rc;
    size_t corr;

    while ( nmemb )
    {
        /* algorithm needs -1 correction if remaining elements are an even number. */
        corr = nmemb % 2;
        nmemb /= 2;
        pivot = ( const char * )base + ( nmemb * size );
        rc = compar( key, pivot );

        if ( rc > 0 )
        {
            base = ( const char * )pivot + size;
            /* applying correction */
            nmemb -= ( 1 - corr );
        }
        else if ( rc == 0 )
        {
            return ( void * )pivot;
        }
    }

    return NULL;
}